

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

bool __thiscall LLVMBC::ModuleParseContext::add_type(ModuleParseContext *this,Type *type)

{
  Type *local_8;
  
  local_8 = type;
  std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::push_back
            (&this->types,&local_8);
  return true;
}

Assistant:

bool ModuleParseContext::add_type(Type *type)
{
	types.push_back(type);
	return true;
}